

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InnerMap::TransferTree(InnerMap *this,void **table,size_type index)

{
  bool bVar1;
  pointer __t;
  long *k;
  size_type b;
  Node *node;
  _Self *__x;
  _Self local_60;
  iterator local_58;
  _Base_ptr local_40;
  reference_wrapper<const_long> local_38;
  _Rb_tree_iterator<std::pair<const_long,_void_*>_> local_30;
  iterator tree_it;
  Tree *tree;
  size_type index_local;
  void **table_local;
  InnerMap *this_local;
  
  tree_it._M_node = (_Base_ptr)table[index];
  local_30._M_node =
       (_Base_ptr)
       std::
       map<long,_void_*,_std::less<long>,_google::protobuf::internal::MapAllocator<std::pair<const_long,_void_*>_>_>
       ::begin((map<long,_void_*,_std::less<long>,_google::protobuf::internal::MapAllocator<std::pair<const_long,_void_*>_>_>
                *)tree_it._M_node);
  do {
    __t = std::_Rb_tree_iterator<std::pair<const_long,_void_*>_>::operator->(&local_30);
    local_38 = std::cref<long>(&__t->first);
    k = std::reference_wrapper<const_long>::get(&local_38);
    b = BucketNumber<long>(this,k);
    local_40 = local_30._M_node;
    node = NodeFromTreeIterator((TreeIterator)local_30._M_node);
    InsertUnique(&local_58,this,b,node);
    __x = std::_Rb_tree_iterator<std::pair<const_long,_void_*>_>::operator++(&local_30);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<long,_void_*,_std::less<long>,_google::protobuf::internal::MapAllocator<std::pair<const_long,_void_*>_>_>
         ::end(tree_it._M_node);
    bVar1 = std::operator!=(__x,&local_60);
  } while (bVar1);
  DestroyTree(this,(Tree *)tree_it._M_node);
  return;
}

Assistant:

void TransferTree(void* const* table, size_type index) {
      Tree* tree = static_cast<Tree*>(table[index]);
      typename Tree::iterator tree_it = tree->begin();
      do {
        InsertUnique(BucketNumber(std::cref(tree_it->first).get()),
                     NodeFromTreeIterator(tree_it));
      } while (++tree_it != tree->end());
      DestroyTree(tree);
    }